

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

bool EvaluateToBuffer(InstructionVMEvalContext *ctx,VmModule *module,char *resultBuf,
                     uint resultBufSize)

{
  bool bVar1;
  VmConstant *pVVar2;
  VmConstant *value;
  uint resultBufSize_local;
  char *resultBuf_local;
  VmModule *module_local;
  InstructionVMEvalContext *ctx_local;
  
  pVVar2 = EvaluateModule(ctx,module);
  if (pVVar2 == (VmConstant *)0x0) {
    ctx_local._7_1_ = false;
  }
  else {
    bVar1 = VmType::operator==(&(pVVar2->super_VmValue).type,&VmType::Int);
    if (bVar1) {
      NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%d",(ulong)(uint)pVVar2->iValue);
    }
    else {
      bVar1 = VmType::operator==(&(pVVar2->super_VmValue).type,&VmType::Double);
      if (bVar1) {
        NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%f",pVVar2->dValue);
      }
      else {
        bVar1 = VmType::operator==(&(pVVar2->super_VmValue).type,&VmType::Long);
        if (bVar1) {
          NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%lldL",pVVar2->lValue);
        }
        else {
          NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"unknown");
        }
      }
    }
    ctx_local._7_1_ = true;
  }
  return ctx_local._7_1_;
}

Assistant:

bool EvaluateToBuffer(InstructionVMEvalContext &ctx, VmModule *module, char *resultBuf, unsigned resultBufSize)
{
	if(VmConstant *value = EvaluateModule(ctx, module))
	{
		if(value->type == VmType::Int)
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "%d", value->iValue);
		}
		else if(value->type == VmType::Double)
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "%f", value->dValue);
		}
		else if(value->type == VmType::Long)
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "%lldL", value->lValue);
		}
		else
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "unknown");
		}

		return true;
	}

	return false;
}